

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qvariantanimation.cpp
# Opt level: O0

void QVariantAnimation::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  undefined4 *puVar2;
  undefined8 *puVar3;
  bool bVar4;
  undefined4 uVar5;
  QVariantAnimation *this;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  QBindable<int> QVar6;
  QBindable<QEasingCurve> QVar7;
  void *_v_1;
  void *_v;
  QVariantAnimation *_t;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  QVariant *in_stack_ffffffffffffff20;
  QVariant *in_stack_ffffffffffffff28;
  QUntypedPropertyData *local_90;
  QBindableInterface *local_88;
  QUntypedPropertyData *local_80;
  QBindableInterface *local_78;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_ESI == 0) && (in_EDX == 0)) {
    valueChanged((QVariantAnimation *)in_stack_ffffffffffffff20,
                 (QVariant *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  }
  if ((in_ESI != 5) ||
     (bVar4 = QtMocHelpers::indexOfMethod<void(QVariantAnimation::*)(QVariant_const&)>
                        (in_RCX,(void **)valueChanged,0,0), !bVar4)) {
    if (in_ESI == 1) {
      puVar2 = *(undefined4 **)in_RCX;
      in_stack_ffffffffffffff28 = (QVariant *)(ulong)in_EDX;
      switch(in_stack_ffffffffffffff28) {
      case (QVariant *)0x0:
        startValue((QVariantAnimation *)
                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        ::QVariant::operator=(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
        ::QVariant::~QVariant(in_stack_ffffffffffffff20);
        break;
      case (QVariant *)0x1:
        endValue((QVariantAnimation *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18))
        ;
        ::QVariant::operator=(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
        ::QVariant::~QVariant(in_stack_ffffffffffffff20);
        break;
      case (QVariant *)0x2:
        currentValue((QVariantAnimation *)in_stack_ffffffffffffff28);
        ::QVariant::operator=(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
        ::QVariant::~QVariant(in_stack_ffffffffffffff20);
        break;
      case (QVariant *)0x3:
        uVar5 = (**(code **)(*in_RDI + 0x60))();
        *puVar2 = uVar5;
        break;
      case (QVariant *)0x4:
        easingCurve((QVariantAnimation *)in_stack_ffffffffffffff28);
        QEasingCurve::operator=
                  ((QEasingCurve *)in_stack_ffffffffffffff20,
                   (QEasingCurve *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        QEasingCurve::~QEasingCurve((QEasingCurve *)in_stack_ffffffffffffff20);
      }
    }
    if (in_ESI == 2) {
      this = (QVariantAnimation *)(ulong)in_EDX;
      switch(this) {
      case (QVariantAnimation *)0x0:
        setStartValue(this,(QVariant *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)
                     );
        break;
      case (QVariantAnimation *)0x1:
        setEndValue(this,(QVariant *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        break;
      default:
        break;
      case (QVariantAnimation *)0x3:
        setDuration((QVariantAnimation *)in_stack_ffffffffffffff28,0);
        break;
      case (QVariantAnimation *)0x4:
        setEasingCurve(*(QVariantAnimation **)in_RCX,(QEasingCurve *)in_stack_ffffffffffffff28);
      }
    }
    if (in_ESI == 8) {
      if (in_EDX == 3) {
        QVar6 = bindableDuration((QVariantAnimation *)in_stack_ffffffffffffff28);
        puVar3 = *(undefined8 **)in_RCX;
        local_80 = QVar6.super_QUntypedBindable.data;
        *puVar3 = local_80;
        local_78 = QVar6.super_QUntypedBindable.iface;
        puVar3[1] = local_78;
      }
      else if (in_EDX == 4) {
        QVar7 = bindableEasingCurve((QVariantAnimation *)in_stack_ffffffffffffff28);
        puVar3 = *(undefined8 **)in_RCX;
        local_90 = QVar7.super_QUntypedBindable.data;
        *puVar3 = local_90;
        local_88 = QVar7.super_QUntypedBindable.iface;
        puVar3[1] = local_88;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QVariantAnimation::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QVariantAnimation *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->valueChanged((*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QVariantAnimation::*)(const QVariant & )>(_a, &QVariantAnimation::valueChanged, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QVariant*>(_v) = _t->startValue(); break;
        case 1: *reinterpret_cast<QVariant*>(_v) = _t->endValue(); break;
        case 2: *reinterpret_cast<QVariant*>(_v) = _t->currentValue(); break;
        case 3: *reinterpret_cast<int*>(_v) = _t->duration(); break;
        case 4: *reinterpret_cast<QEasingCurve*>(_v) = _t->easingCurve(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setStartValue(*reinterpret_cast<QVariant*>(_v)); break;
        case 1: _t->setEndValue(*reinterpret_cast<QVariant*>(_v)); break;
        case 3: _t->setDuration(*reinterpret_cast<int*>(_v)); break;
        case 4: _t->setEasingCurve(*reinterpret_cast<QEasingCurve*>(_v)); break;
        default: break;
        }
    }
    if (_c == QMetaObject::BindableProperty) {
        switch (_id) {
        case 3: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableDuration(); break;
        case 4: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableEasingCurve(); break;
        default: break;
        }
    }
}